

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9MuxProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uint fVerbose;
  char *pcVar7;
  uint local_44;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar1 = false;
  local_44 = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar4 = Extra_UtilGetopt(argc,argv,"Nnmavh"), iVar5 = globalUtilOptind, iVar4 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar4 < 0x61) break;
      if (iVar4 == 0x61) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar4 == 0x6d) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else {
        if (iVar4 != 0x6e) goto LAB_0026f9f0;
        bVar2 = (bool)(bVar2 ^ 1);
      }
    }
    if (iVar4 == -1) {
      p = pAbc->pGia;
      if (p == (Gia_Man_t *)0x0) {
        pcVar6 = "Abc_CommandAbc9MuxProfile(): There is no AIG.\n";
      }
      else {
        if (!bVar2) {
          if (bVar3) {
            Gia_ManMuxProfiling(p);
          }
          else if (bVar1) {
            Acec_ManProfile(p,fVerbose);
          }
          else {
            Gia_ManProfileStructures(p,local_44,fVerbose);
          }
          return 0;
        }
        if ((p->vMapping != (Vec_Int_t *)0x0) && (iVar5 = Gia_ManLutSizeMax(p), iVar5 < 4)) {
          Acec_StatsCollect(pAbc->pGia,fVerbose);
          return 0;
        }
        pcVar6 = "Abc_CommandAbc9MuxProfile(): Expecting AIG mapped into 3-LUTs.\n";
      }
      iVar5 = -1;
      goto LAB_0026fac1;
    }
    if (iVar4 != 0x4e) goto LAB_0026f9f0;
    if (argc <= globalUtilOptind) break;
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)local_44 < 0) {
LAB_0026f9f0:
      Abc_Print(-2,"usage: &profile [-N num] [-nmavh]\n");
      Abc_Print(-2,"\t         profile gate structures appearing in the AIG\n");
      Abc_Print(-2,"\t-N num : limit on class size to show [default = %d]\n",(ulong)local_44);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-n     : toggle profiling NPN-classes (for 3-LUT mapped AIGs) [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (!bVar3) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle profiling MUX structures [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle profiling adder structures [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_0026fac1:
      Abc_Print(iVar5,pcVar6);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0026f9f0;
}

Assistant:

int Abc_CommandAbc9MuxProfile( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManMuxProfiling( Gia_Man_t * p );
    extern void Gia_ManProfileStructures( Gia_Man_t * p, int nLimit, int fVerbose );
    extern void Acec_StatsCollect( Gia_Man_t * p, int fVerbose );
    extern void Acec_ManProfile( Gia_Man_t * p, int fVerbose );
    int c, fNpn = 0, fMuxes = 0, fAdders = 0, nLimit = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nnmavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLimit < 0 )
                goto usage;
            break;
        case 'n':
            fNpn ^= 1;
            break;
        case 'm':
            fMuxes ^= 1;
            break;
        case 'a':
            fAdders ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MuxProfile(): There is no AIG.\n" );
        return 1;
    }
    if ( fNpn )
    {
        if ( !Gia_ManHasMapping(pAbc->pGia) || Gia_ManLutSizeMax(pAbc->pGia) >= 4 )
        {
            Abc_Print( -1, "Abc_CommandAbc9MuxProfile(): Expecting AIG mapped into 3-LUTs.\n" );
            return 1;
        }
        Acec_StatsCollect( pAbc->pGia, fVerbose );
    }
    else if ( fMuxes )
        Gia_ManMuxProfiling( pAbc->pGia );
    else if ( fAdders )
        Acec_ManProfile( pAbc->pGia, fVerbose );
    else
        Gia_ManProfileStructures( pAbc->pGia, nLimit, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &profile [-N num] [-nmavh]\n" );
    Abc_Print( -2, "\t         profile gate structures appearing in the AIG\n" );
    Abc_Print( -2, "\t-N num : limit on class size to show [default = %d]\n", nLimit );
    Abc_Print( -2, "\t-n     : toggle profiling NPN-classes (for 3-LUT mapped AIGs) [default = %s]\n", fNpn? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle profiling MUX structures [default = %s]\n", fMuxes? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle profiling adder structures [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}